

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_RegVm.cpp
# Opt level: O1

bool __thiscall
ExecutorRegVm::RunExternalFunction(ExecutorRegVm *this,uint funcID,uint *callStorage)

{
  this->codeRunning = false;
  this->callContinue = false;
  NULLC::SafeSprintf(this->execErrorBuffer,0x10000,"%s",
                     "ERROR: external raw function calls are disabled");
  this->execErrorMessage = this->execErrorBuffer;
  (this->execErrorObject).typeID = 0;
  (this->execErrorObject).ptr = (char *)0x0;
  return false;
}

Assistant:

bool ExecutorRegVm::RunExternalFunction(unsigned funcID, unsigned *callStorage)
{
#if !defined(NULLC_NO_RAW_EXTERNAL_CALL)
	RunRawExternalFunction(dcCallVM, exFunctions[funcID], exLinker->exLocals.data, exTypes.data, exLinker->exTypeExtra.data, callStorage, callStorage);

	return callContinue;
#else
	(void)funcID;
	(void)callStorage;

	Stop("ERROR: external raw function calls are disabled");

	return false;
#endif
}